

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O0

void __thiscall FBX::Decoder::initVersion(Decoder *this)

{
  size_type __n;
  int iVar1;
  allocator_type local_2a;
  value_type_conflict local_29;
  vector<char,_std::allocator<char>_> local_28;
  Decoder *local_10;
  Decoder *this_local;
  
  local_10 = this;
  iVar1 = readuInt(this);
  this->version = iVar1;
  if (this->version < 0x1d4c) {
    this->blockLength = 0xd;
    this->isuInt32 = true;
  }
  else {
    this->blockLength = 0x19;
    this->isuInt32 = false;
  }
  __n = this->blockLength;
  local_29 = '\0';
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector(&local_28,__n,&local_29,&local_2a);
  std::vector<char,_std::allocator<char>_>::operator=(&this->blockData,&local_28);
  std::vector<char,_std::allocator<char>_>::~vector(&local_28);
  std::allocator<char>::~allocator(&local_2a);
  return;
}

Assistant:

void Decoder::initVersion() {
        version = readuInt();

        if (version < 7500) {
            blockLength = 13;
            isuInt32 = true;
        } else {
            blockLength = 25;
            isuInt32 = false;
        }
        blockData = std::vector(blockLength, '\0');
    }